

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subtree.c
# Opt level: O2

void ts_external_scanner_state_init(ExternalScannerState *self,char *data,uint length)

{
  ExternalScannerState *pEVar1;
  
  self->length = length;
  if (0x18 < length) {
    pEVar1 = (ExternalScannerState *)ts_malloc((ulong)length);
    (self->field_0).long_data = (char *)pEVar1;
    self = pEVar1;
  }
  memcpy(self,data,(ulong)length);
  return;
}

Assistant:

void ts_external_scanner_state_init(ExternalScannerState *self, const char *data, unsigned length) {
  self->length = length;
  if (length > sizeof(self->short_data)) {
    self->long_data = ts_malloc(length);
    memcpy(self->long_data, data, length);
  } else {
    memcpy(self->short_data, data, length);
  }
}